

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O2

directed_flag_complex_coboundary_cell_t * __thiscall
directed_flag_complex_cell_t::insert_vertex
          (directed_flag_complex_coboundary_cell_t *__return_storage_ptr__,
          directed_flag_complex_cell_t *this,size_t position,vertex_index_t vertex)

{
  (__return_storage_ptr__->super_directed_flag_complex_cell_t).vertices = this->vertices;
  (__return_storage_ptr__->super_directed_flag_complex_cell_t)._vptr_directed_flag_complex_cell_t =
       (_func_int **)&PTR_vertex_00122888;
  __return_storage_ptr__->_insert_position = position & 0xffff;
  __return_storage_ptr__->_insert_vertex = vertex;
  return __return_storage_ptr__;
}

Assistant:

directed_flag_complex_coboundary_cell_t directed_flag_complex_cell_t::insert_vertex(size_t position,
                                                                                    vertex_index_t vertex) {
#ifdef USE_CELLS_WITHOUT_DIMENSION
	return directed_flag_complex_coboundary_cell_t(vertices, vertex, (unsigned short)position);
#else
	return directed_flag_complex_coboundary_cell_t(dim, vertices, vertex, (unsigned short)position);
#endif
}